

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory memory;
  AFM_Parser pAVar1;
  byte bVar2;
  int iVar3;
  AFM_Token AVar4;
  FT_Int FVar5;
  char *pcVar6;
  AFM_KernPair pAVar7;
  ulong uVar8;
  AFM_TrackKern pAVar9;
  AFM_ValueType_ AVar10;
  bool bVar11;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *len_00;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  undefined8 extraout_RDX_05;
  FT_Offset *extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  undefined8 extraout_RDX_11;
  FT_Offset *extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  FT_Offset *extraout_RDX_16;
  FT_Offset *extraout_RDX_17;
  FT_Offset *extraout_RDX_18;
  FT_Offset *extraout_RDX_19;
  FT_Offset *extraout_RDX_20;
  FT_Offset *extraout_RDX_21;
  FT_Offset *extraout_RDX_22;
  AFM_ValueType_ AVar13;
  int iVar14;
  AFM_FontInfo pAVar15;
  FT_Error FVar16;
  AFM_ValueType_ AVar17;
  AFM_FontInfo pAVar18;
  FT_Offset local_c0;
  AFM_FontInfo local_b8;
  AFM_Parser local_b0;
  ulong local_a8;
  FT_Offset local_a0;
  FT_Offset len_1;
  FT_Offset len;
  undefined1 local_88 [8];
  AFM_ValueRec shared_vals [4];
  FT_Fixed local_40;
  AFM_ValueType_ local_34;
  FT_Offset *pFVar12;
  
  pAVar15 = parser->FontInfo;
  if (pAVar15 == (AFM_FontInfo)0x0) {
    FVar16 = 6;
  }
  else {
    memory = parser->memory;
    pcVar6 = afm_parser_next_key(parser,(FT_Bool)&len_1,in_RDX);
    AVar17 = AFM_VALUE_TYPE_FIXED;
    FVar16 = 2;
    if (((pcVar6 != (char *)0x0) && (len_1 == 0x10)) &&
       (iVar3 = strncmp(pcVar6,"StartFontMetrics",0x10), iVar3 == 0)) {
      local_a8 = 0;
      pFVar12 = extraout_RDX;
      AVar10 = 0xa0;
LAB_0020ae7c:
      pcVar6 = afm_parser_next_key(parser,(FT_Bool)&len_1,pFVar12);
      AVar13 = AVar10;
      if (pcVar6 != (char *)0x0) {
        AVar4 = afm_tokenize(pcVar6,len_1);
        bVar2 = 1;
        pFVar12 = len_00;
        if (0x1d < (int)AVar4) {
          if ((int)AVar4 < 0x2d) {
            if (AVar4 == AFM_TOKEN_ISCIDFONT) {
              local_88._0_4_ = AFM_VALUE_TYPE_BOOL;
              FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
              bVar2 = 5;
              pFVar12 = extraout_RDX_18;
              if (FVar5 != 1) goto LAB_0020b4dc;
              pAVar15->IsCIDFont = (undefined1)shared_vals[0].type;
            }
            else if (AVar4 == AFM_TOKEN_METRICSSETS) {
              local_88._0_4_ = AFM_VALUE_TYPE_INTEGER;
              FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
              if (FVar5 == 1) {
                local_a8 = (ulong)shared_vals[0].type;
              }
              bVar2 = 5;
              pFVar12 = extraout_RDX_01;
              if ((FVar5 != 1) ||
                 (AVar13 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER, (local_a8 & 0xfffffffd) != 0)
                 ) goto LAB_0020b4dc;
            }
            goto LAB_0020b413;
          }
          if (AVar4 != AFM_TOKEN_STARTCHARMETRICS) {
            if (AVar4 != AFM_TOKEN_STARTKERNDATA) goto LAB_0020b413;
            pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_c0,len_00);
            pFVar12 = extraout_RDX_03;
            pAVar1 = parser;
            pAVar18 = pAVar15;
            if (pcVar6 != (char *)0x0) {
LAB_0020b00b:
              len = (FT_Offset)pAVar18;
              local_b0 = pAVar1;
              AVar4 = afm_tokenize(pcVar6,local_c0);
              pFVar12 = extraout_RDX_04;
              if ((int)AVar4 < 0x35) {
                if (AVar4 - AFM_TOKEN_STARTKERNPAIRS < 2) {
                  pAVar18 = parser->FontInfo;
                  local_88._0_4_ = AFM_VALUE_TYPE_INTEGER;
                  FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
                  bVar11 = (int)shared_vals[0].type < 0 || FVar5 != 1;
                  pFVar12 = (FT_Offset *)CONCAT71((int7)((ulong)extraout_RDX_05 >> 8),bVar11);
                  if (bVar11) {
LAB_0020b23c:
                    AVar13 = 0xa0;
                  }
                  else {
                    pAVar18->NumKernPair = shared_vals[0].type;
                    local_34 = AVar13;
                    if (shared_vals[0].type != AFM_VALUE_TYPE_STRING) {
                      pAVar7 = (AFM_KernPair)
                               ft_mem_realloc(parser->memory,0x10,0,(ulong)shared_vals[0].type,
                                              (void *)0x0,(FT_Error *)local_88);
                      pAVar18->KernPairs = pAVar7;
                      pFVar12 = extraout_RDX_06;
                      local_34 = local_88._0_4_;
                      AVar13 = local_88._0_4_;
                      if (local_88._0_4_ != AFM_VALUE_TYPE_STRING) goto LAB_0020b241;
                    }
                    iVar3 = -1;
                    local_b8 = pAVar18;
                    do {
                      pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_a0,pFVar12);
                      pFVar12 = extraout_RDX_07;
                      if (pcVar6 == (char *)0x0) goto LAB_0020b39e;
                      AVar4 = afm_tokenize(pcVar6,local_a0);
                      iVar14 = 2;
                      uVar8 = (ulong)(AVar4 - AFM_TOKEN_ENDFONTMETRICS);
                      pFVar12 = extraout_RDX_08;
                      if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 0x38) {
                        if ((7UL >> (uVar8 & 0x3f) & 1) == 0) {
                          if ((0x34000UL >> (uVar8 & 0x3f) & 1) == 0) {
                            if (uVar8 == 0x37) goto LAB_0020b1d9;
                          }
                          else {
                            iVar3 = iVar3 + 1;
                            iVar14 = 2;
                            if (iVar3 < (int)pAVar18->NumKernPair) {
                              pAVar7 = pAVar18->KernPairs + iVar3;
                              local_88._0_4_ = AFM_VALUE_TYPE_INDEX;
                              shared_vals[0].u.i = 5;
                              shared_vals[1].u.i = 3;
                              shared_vals[2].u.i = 3;
                              FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,4);
                              pFVar12 = extraout_RDX_09;
                              parser = local_b0;
                              pAVar18 = local_b8;
                              if (FVar5 < 3) {
                                bVar11 = false;
                              }
                              else {
                                pAVar7->index1 = shared_vals[0].type;
                                pAVar7->index2 = shared_vals[1].type;
                                if (AVar4 == AFM_TOKEN_KPY) {
                                  pAVar7->x = 0;
                                  AVar10 = shared_vals[2].type;
                                }
                                else {
                                  pAVar7->x = shared_vals[2].type;
                                  AVar10 = AFM_VALUE_TYPE_STRING;
                                  if (FVar5 == 4 && AVar4 == AFM_TOKEN_KP) {
                                    AVar10 = shared_vals[3].type;
                                  }
                                }
                                pAVar7->y = AVar10;
                                bVar11 = true;
                                iVar14 = 0;
                              }
                            }
                            else {
                              bVar11 = false;
                            }
                            if (bVar11) {
LAB_0020b1d9:
                              iVar14 = 0;
                            }
                          }
                        }
                        else {
                          pAVar18->NumKernPair = iVar3 + 1U;
                          qsort(pAVar18->KernPairs,(ulong)(iVar3 + 1U),0x10,afm_compare_kern_pairs);
                          local_34 = AFM_VALUE_TYPE_STRING;
                          iVar14 = 1;
                          pFVar12 = extraout_RDX_10;
                        }
                      }
                    } while (iVar14 == 0);
                    pAVar15 = (AFM_FontInfo)len;
                    AVar13 = 0xa0;
                    if (iVar14 != 2) {
                      AVar13 = local_34;
                    }
                  }
                  goto LAB_0020b241;
                }
                AVar13 = AFM_VALUE_TYPE_STRING;
                if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) goto LAB_0020b4c7;
              }
              else {
                if (AVar4 == AFM_TOKEN_UNKNOWN) goto LAB_0020b249;
                if (AVar4 == AFM_TOKEN_STARTTRACKKERN) {
                  pAVar18 = parser->FontInfo;
                  local_88._0_4_ = AFM_VALUE_TYPE_INTEGER;
                  FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
                  pFVar12 = (FT_Offset *)
                            CONCAT71((int7)((ulong)extraout_RDX_11 >> 8),
                                     (int)shared_vals[0].type < 0 || FVar5 != 1);
                  if ((int)shared_vals[0].type < 0 || FVar5 != 1) goto LAB_0020b23c;
                  pAVar18->NumTrackKern = shared_vals[0].type;
                  AVar10 = AVar13;
                  if (shared_vals[0].type != AFM_VALUE_TYPE_STRING) {
                    pAVar9 = (AFM_TrackKern)
                             ft_mem_realloc(parser->memory,0x28,0,(ulong)shared_vals[0].type,
                                            (void *)0x0,(FT_Error *)local_88);
                    pAVar18->TrackKerns = pAVar9;
                    pFVar12 = extraout_RDX_13;
                    AVar13 = local_88._0_4_;
                    AVar10 = local_88._0_4_;
                    if (local_88._0_4_ != AFM_VALUE_TYPE_STRING) goto LAB_0020b241;
                  }
                  iVar3 = -1;
                  do {
                    pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_a0,pFVar12);
                    pFVar12 = extraout_RDX_14;
                    if (pcVar6 == (char *)0x0) goto LAB_0020b39e;
                    AVar4 = afm_tokenize(pcVar6,local_a0);
                    iVar14 = 2;
                    pFVar12 = extraout_RDX_15;
                    if ((int)AVar4 < 0x38) {
                      if ((AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) ||
                         (AVar4 == AFM_TOKEN_ENDTRACKKERN)) {
                        pAVar18->NumTrackKern = iVar3 + 1;
                        AVar10 = AFM_VALUE_TYPE_STRING;
                        iVar14 = 1;
                      }
                    }
                    else if (AVar4 == AFM_TOKEN_UNKNOWN) {
                      iVar14 = 0;
                    }
                    else if ((AVar4 == AFM_TOKEN_TRACKKERN) &&
                            (iVar3 = iVar3 + 1, iVar3 < (int)pAVar18->NumTrackKern)) {
                      pAVar9 = pAVar18->TrackKerns;
                      local_88._0_4_ = AFM_VALUE_TYPE_INTEGER;
                      shared_vals[0].u.i = 2;
                      shared_vals[1].u.i = 2;
                      shared_vals[2].u.i = 2;
                      shared_vals[3].u.i = 2;
                      FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,5);
                      pFVar12 = extraout_RDX_16;
                      iVar14 = 2;
                      if (FVar5 == 5) {
                        pAVar9[iVar3].degree = shared_vals[0].type;
                        pAVar9[iVar3].min_ptsize =
                             CONCAT44(shared_vals[1]._4_4_,shared_vals[1].type);
                        pAVar9[iVar3].min_kern = CONCAT44(shared_vals[2]._4_4_,shared_vals[2].type);
                        pAVar9[iVar3].max_ptsize =
                             CONCAT44(shared_vals[3]._4_4_,shared_vals[3].type);
                        pAVar9[iVar3].max_kern = local_40;
                        iVar14 = 0;
                      }
                    }
                  } while (iVar14 == 0);
                  pAVar15 = (AFM_FontInfo)len;
                  AVar13 = 0xa0;
                  if (iVar14 != 2) {
                    AVar13 = AVar10;
                  }
                  goto LAB_0020b241;
                }
              }
            }
LAB_0020b4c2:
            AVar13 = 0xa0;
LAB_0020b4c7:
            if (AVar13 == AFM_VALUE_TYPE_STRING) {
              AVar17 = AFM_VALUE_TYPE_STRING;
              AVar13 = AFM_VALUE_TYPE_STRING;
              bVar2 = 1;
            }
            else {
              bVar2 = 5;
            }
            goto LAB_0020b4dc;
          }
          local_88._0_4_ = AFM_VALUE_TYPE_INTEGER;
          FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
          if (FVar5 == 1) {
            iVar3 = shared_vals[0].type + AFM_VALUE_TYPE_NAME;
            pFVar12 = extraout_RDX_19;
            do {
              iVar3 = iVar3 + -1;
              if (iVar3 < 1) goto LAB_0020b474;
              bVar11 = false;
              pcVar6 = afm_parser_next_key(parser,'\0',pFVar12);
              pFVar12 = extraout_RDX_20;
            } while (pcVar6 != (char *)0x0);
LAB_0020b45e:
            AVar13 = 0xa0;
            goto LAB_0020b463;
          }
          bVar11 = false;
          bVar2 = 5;
          pFVar12 = extraout_RDX_19;
          goto LAB_0020b4ab;
        }
        if ((int)AVar4 < 0x14) {
          if (AVar4 == AFM_TOKEN_ASCENDER) {
            local_88._0_4_ = AFM_VALUE_TYPE_FIXED;
            FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
            bVar2 = 5;
            pFVar12 = extraout_RDX_17;
            if (FVar5 != 1) goto LAB_0020b4dc;
            pAVar15->Ascender = CONCAT44(shared_vals[0]._4_4_,shared_vals[0].type);
          }
          else if (AVar4 == AFM_TOKEN_DESCENDER) {
            local_88._0_4_ = AFM_VALUE_TYPE_FIXED;
            FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,1);
            bVar2 = 5;
            pFVar12 = extraout_RDX_00;
            if (FVar5 != 1) goto LAB_0020b4dc;
            pAVar15->Descender = CONCAT44(shared_vals[0]._4_4_,shared_vals[0].type);
          }
          goto LAB_0020b413;
        }
        if (AVar4 != AFM_TOKEN_ENDFONTMETRICS) {
          if (AVar4 == AFM_TOKEN_FONTBBOX) {
            local_88._0_4_ = AFM_VALUE_TYPE_FIXED;
            shared_vals[0].u.i = 2;
            shared_vals[1].u.i = 2;
            shared_vals[2].u.i = 2;
            FVar5 = afm_parser_read_vals(parser,(AFM_Value)local_88,4);
            bVar2 = 5;
            pFVar12 = extraout_RDX_02;
            if (FVar5 != 4) goto LAB_0020b4dc;
            (pAVar15->FontBBox).xMin = CONCAT44(shared_vals[0]._4_4_,shared_vals[0].type);
            (pAVar15->FontBBox).yMin = CONCAT44(shared_vals[1]._4_4_,shared_vals[1].type);
            (pAVar15->FontBBox).xMax = CONCAT44(shared_vals[2]._4_4_,shared_vals[2].type);
            (pAVar15->FontBBox).yMax = CONCAT44(shared_vals[3]._4_4_,shared_vals[3].type);
          }
          goto LAB_0020b413;
        }
        AVar17 = AFM_VALUE_TYPE_STRING;
        goto LAB_0020b4dc;
      }
      goto LAB_0020b4e9;
    }
  }
  return FVar16;
LAB_0020b39e:
  pAVar15 = (AFM_FontInfo)len;
  AVar13 = 0xa0;
LAB_0020b241:
  if (AVar13 != AFM_VALUE_TYPE_STRING) goto LAB_0020b4c7;
LAB_0020b249:
  pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_c0,pFVar12);
  pFVar12 = extraout_RDX_12;
  pAVar1 = local_b0;
  pAVar18 = (AFM_FontInfo)len;
  if (pcVar6 == (char *)0x0) goto LAB_0020b4c2;
  goto LAB_0020b00b;
  while( true ) {
    AVar4 = afm_tokenize(pcVar6,CONCAT44(local_88._4_4_,local_88._0_4_));
    AVar13 = AFM_VALUE_TYPE_STRING;
    pFVar12 = extraout_RDX_22;
    if ((AVar4 == AFM_TOKEN_ENDFONTMETRICS) || (AVar4 == AFM_TOKEN_ENDCHARMETRICS)) break;
LAB_0020b474:
    pcVar6 = afm_parser_next_key(parser,(FT_Bool)local_88,pFVar12);
    bVar11 = pcVar6 != (char *)0x0;
    pFVar12 = extraout_RDX_21;
    if (pcVar6 == (char *)0x0) goto LAB_0020b45e;
  }
LAB_0020b463:
  if (bVar11 == false) {
    AVar17 = AVar13;
  }
  bVar2 = bVar11 ^ 1;
LAB_0020b4ab:
  AVar10 = AVar13;
  if (bVar11 != false) {
LAB_0020b413:
    bVar2 = 0;
    AVar13 = AVar10;
  }
LAB_0020b4dc:
  AVar10 = AVar13;
  if (bVar2 != 0) {
    if (bVar2 != 5) {
      return AVar17;
    }
LAB_0020b4e9:
    ft_mem_free(memory,pAVar15->TrackKerns);
    pAVar15->TrackKerns = (AFM_TrackKern)0x0;
    pAVar15->NumTrackKern = 0;
    ft_mem_free(memory,pAVar15->KernPairs);
    pAVar15->KernPairs = (AFM_KernPair)0x0;
    pAVar15->NumKernPair = 0;
    pAVar15->IsCIDFont = '\0';
    return AVar13;
  }
  goto LAB_0020ae7c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }